

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaopen_string(lua_State *L)

{
  StkId pTVar1;
  int nrec;
  
  luaL_register(L,"string",strlib);
  lua_createtable(L,1,nrec);
  lua_pushlstring(L,"",0);
  pTVar1 = L->top;
  pTVar1->value = pTVar1[-2].value;
  pTVar1->tt = pTVar1[-2].tt;
  L->top = L->top + 1;
  lua_setmetatable(L,-2);
  pTVar1 = L->top;
  L->top = pTVar1 + -1;
  pTVar1[-1].value = pTVar1[-3].value;
  pTVar1[-1].tt = pTVar1[-3].tt;
  L->top = L->top + 1;
  lua_setfield(L,-2,"__index");
  L->top = L->top + -1;
  return 1;
}

Assistant:

static int luaopen_string(lua_State*L){
luaL_register(L,"string",strlib);
createmetatable(L);
return 1;
}